

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

bool mjs::operator==(token *l,token *r)

{
  token_type tVar1;
  size_t __n;
  int iVar2;
  
  tVar1 = l->type_;
  if (tVar1 == r->type_) {
    if (tVar1 != string_literal) {
      if (tVar1 == numeric_literal) {
        return (bool)(-((r->field_1).dvalue_ == (l->field_1).dvalue_) & 1);
      }
      if (tVar1 != identifier) {
        return true;
      }
    }
    if ((tVar1 != identifier) && (tVar1 != string_literal)) {
      __assert_fail("has_text()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                    0xd6,"const std::wstring &mjs::token::text() const");
    }
    __n = (l->field_1).text_._M_string_length;
    if (__n == (r->field_1).text_._M_string_length) {
      if (__n == 0) {
        return true;
      }
      iVar2 = wmemcmp((wchar_t *)(l->field_1).ivalue_,(wchar_t *)(r->field_1).ivalue_,__n);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool operator==(const token& l, const token& r) {
    if (l.type() != r.type()) {
        return false;
    } else if (l.has_text()) {
        return l.text() == r.text();
    } else if (l.type() == token_type::numeric_literal) {
        return l.dvalue() == r.dvalue();
    }
    return true;
}